

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall AllFloatsParseTest::RunShard(AllFloatsParseTest *this,int shard)

{
  bool bVar1;
  float fVar2;
  int iVar3;
  char *pcVar4;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c0;
  Message local_b8;
  Result local_b0;
  Enum local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  uint32_t me;
  int len;
  float value;
  int top_byte;
  int last_top_byte;
  uint32_t bits;
  uint32_t last_bits;
  char buffer [100];
  int shard_local;
  AllFloatsParseTest *this_local;
  
  last_top_byte = 0;
  value = -NAN;
  top_byte = shard;
  buffer._92_4_ = shard;
  unique0x100003ae = this;
  do {
    if ((uint)top_byte < (uint)last_top_byte) {
      if (buffer._92_4_ == 0) {
        printf("done.\n");
        fflush(_stdout);
      }
      return;
    }
    if ((buffer._92_4_ == 0) && (fVar2 = (float)((uint)top_byte >> 0x18), fVar2 != value)) {
      printf("value: 0x%08x (%d%%)\r",(ulong)(uint)top_byte,
             (ulong)(uint)(int)(((double)(uint)top_byte * 100.0) / 4294967295.0));
      fflush(_stdout);
      value = fVar2;
    }
    bVar1 = is_infinity_or_nan(top_byte);
    if (!bVar1) {
      fVar2 = bit_cast<float,unsigned_int>(top_byte);
      iVar3 = snprintf((char *)&bits,100,"%a",(double)fVar2);
      local_ac = Ok;
      local_b0 = wabt::ParseFloat(Hexfloat,(char *)&bits,(char *)((long)&bits + (long)iVar3),
                                  (uint32_t *)((long)&gtest_ar.message_.ptr_ + 4));
      testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
                ((EqHelper<false> *)local_a8,"Result::Ok",
                 "ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me)",&local_ac,&local_b0)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_b8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-hexfloat.cc"
                   ,0x6e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::Message::~Message(&local_b8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
        return;
      }
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_d8,"me","bits",(uint *)((long)&gtest_ar.message_.ptr_ + 4)
                 ,(uint *)&top_byte);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-hexfloat.cc"
                   ,0x6f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        testing::Message::~Message(&local_e0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) {
        return;
      }
    }
    last_top_byte = top_byte;
    top_byte = (this->super_ThreadedTest).num_threads_ + top_byte;
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      float value = bit_cast<float>(bits);
      int len = snprintf(buffer, sizeof(buffer), "%a", value);

      uint32_t me;
      ASSERT_EQ(Result::Ok,
                ParseFloat(LiteralType::Hexfloat, buffer, buffer + len, &me));
      ASSERT_EQ(me, bits);
    }
    LOG_DONE();
  }